

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

int Ses_ManCreateTruthTableClause(Ses_Man_t *pSes,int t)

{
  Vec_Int_t *p;
  int iVar1;
  int iVar2;
  int local_38;
  int local_34;
  int pLits [3];
  int h;
  int k;
  int j;
  int i;
  int t_local;
  Ses_Man_t *pSes_local;
  
  k = 0;
  do {
    if (pSes->nGates <= k) {
      if (pSes->nSpecFunc == 1) {
        p = pSes->vAssump;
        iVar1 = Ses_ManSimVar(pSes,pSes->nGates + -1,t);
        iVar2 = Abc_TtGetBit(pSes->pSpec,t + 1);
        iVar1 = Abc_Var2Lit(iVar1,1 - iVar2);
        Vec_IntPush(p,iVar1);
      }
      return 1;
    }
    for (h = 0; iVar1 = h, h < pSes->nSpecVars + k; h = h + 1) {
      while (pLits[2] = iVar1 + 1, pLits[2] < pSes->nSpecVars + k) {
        Ses_ManCreateMainClause(pSes,t,k,h,pLits[2],0,0,1);
        Ses_ManCreateMainClause(pSes,t,k,h,pLits[2],0,1,0);
        Ses_ManCreateMainClause(pSes,t,k,h,pLits[2],0,1,1);
        Ses_ManCreateMainClause(pSes,t,k,h,pLits[2],1,0,0);
        Ses_ManCreateMainClause(pSes,t,k,h,pLits[2],1,0,1);
        Ses_ManCreateMainClause(pSes,t,k,h,pLits[2],1,1,0);
        Ses_ManCreateMainClause(pSes,t,k,h,pLits[2],1,1,1);
        iVar1 = pLits[2];
      }
    }
    if (pSes->nSpecFunc != 1) {
      for (pLits[1] = 0; pLits[1] < pSes->nSpecFunc; pLits[1] = pLits[1] + 1) {
        iVar1 = Ses_ManOutputVar(pSes,pLits[1],k);
        local_38 = Abc_Var2Lit(iVar1,1);
        iVar1 = Ses_ManSimVar(pSes,k,t);
        iVar2 = Abc_TtGetBit(pSes->pSpec + (pLits[1] << 2),t + 1);
        local_34 = Abc_Var2Lit(iVar1,1 - iVar2);
        iVar1 = sat_solver_addclause(pSes->pSat,&local_38,pLits);
        if (iVar1 == 0) {
          return 0;
        }
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

static int inline Ses_ManCreateTruthTableClause( Ses_Man_t * pSes, int t )
{
    int i, j, k, h;
    int pLits[3];

    for ( i = 0; i < pSes->nGates; ++i )
    {
        /* main clauses */
        for ( j = 0; j < pSes->nSpecVars + i; ++j )
            for ( k = j + 1; k < pSes->nSpecVars + i; ++k )
            {
                Ses_ManCreateMainClause( pSes, t, i, j, k, 0, 0, 1 );
                Ses_ManCreateMainClause( pSes, t, i, j, k, 0, 1, 0 );
                Ses_ManCreateMainClause( pSes, t, i, j, k, 0, 1, 1 );
                Ses_ManCreateMainClause( pSes, t, i, j, k, 1, 0, 0 );
                Ses_ManCreateMainClause( pSes, t, i, j, k, 1, 0, 1 );
                Ses_ManCreateMainClause( pSes, t, i, j, k, 1, 1, 0 );
                Ses_ManCreateMainClause( pSes, t, i, j, k, 1, 1, 1 );
            }

        /* output clauses */
        if ( pSes->nSpecFunc != 1 )
            for ( h = 0; h < pSes->nSpecFunc; ++h )
            {
                pLits[0] = Abc_Var2Lit( Ses_ManOutputVar( pSes, h, i ), 1 );
                pLits[1] = Abc_Var2Lit( Ses_ManSimVar( pSes, i, t ), 1 - Abc_TtGetBit( &pSes->pSpec[h << 2], t + 1 ) );
                if ( !sat_solver_addclause( pSes->pSat, pLits, pLits + 2 ) )
                    return 0;
            }
    }

    if ( pSes->nSpecFunc == 1 )
        Vec_IntPush( pSes->vAssump, Abc_Var2Lit( Ses_ManSimVar( pSes, pSes->nGates - 1, t ), 1 - Abc_TtGetBit( pSes->pSpec, t + 1 ) ) );

    return 1;
}